

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::LogTest_UnexpectedFullType_Test::~LogTest_UnexpectedFullType_Test
          (LogTest_UnexpectedFullType_Test *this)

{
  LogTest_UnexpectedFullType_Test *this_local;
  
  LogTest::~LogTest(&this->super_LogTest);
  return;
}

Assistant:

TEST_F(LogTest, UnexpectedFullType) {
  Write("foo");
  Write("bar");
  SetByte(6, kFirstType);
  FixChecksum(0, 3);
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("partial record without end"));
}